

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EtherCATStack.cpp
# Opt level: O1

void tEcJobTask(void *pvThreadParamDesc)

{
  EC_T_DWORD EVar1;
  EC_T_DWORD EVar2;
  uint uVar3;
  bool bVar4;
  byte bVar5;
  CAtEmLogging *pCVar6;
  int iVar7;
  uint uVar8;
  EC_T_DWORD EVar9;
  uint uVar10;
  uint uVar11;
  undefined8 uVar12;
  EC_T_BYTE *pEVar13;
  EC_T_BYTE *pEVar14;
  ulong uVar15;
  sbyte sVar16;
  EC_T_DWORD EVar17;
  uint uVar18;
  short sVar19;
  int iVar20;
  EC_T_INT nRemLen;
  int iVar21;
  int iVar22;
  char *szFormat;
  byte *pbVar23;
  uint uVar24;
  int iVar25;
  EC_T_BOOL bPrevCycProcessed;
  EC_T_CHAR *pszLog;
  byte local_3d;
  int local_3c;
  EC_T_CHAR *local_38;
  
  local_3c = 0;
  iVar7 = OsSetThreadAffinity(0,1 << (*(byte *)((long)pvThreadParamDesc + 0x18) & 0x1f));
  if (iVar7 != 0) {
    *(undefined4 *)((long)pvThreadParamDesc + 4) = 1;
    iVar7 = 0;
    do {
      OsWaitForEvent(*(undefined8 *)((long)pvThreadParamDesc + 0x10),0xffffffff);
      ecatPerfMeasEnd(&S_TscMeasDesc,4);
      ecatPerfMeasStart(&S_TscMeasDesc,4);
      ecatPerfMeasStart(&S_TscMeasDesc,0);
      uVar8 = emExecJob(0,1,&local_3c);
      pCVar6 = S_poLog;
      if (((uVar8 != 0x9811000e) && (uVar8 != 0x9811002d)) && (uVar8 != 0)) {
        uVar12 = ecatGetText(uVar8);
        CAtEmLogging::LogError
                  (pCVar6,"ERROR: ecatExecJob( eUsrJob_ProcessAllRxFrames): %s (0x%lx)",uVar12,
                   (ulong)uVar8);
      }
      ecatPerfMeasEnd(&S_TscMeasDesc,0);
      iVar20 = iVar7;
      if (uVar8 == 0) {
        if (local_3c == 0) {
          iVar20 = iVar7 + 10;
          if (iVar7 < 0x28) {
            szFormat = 
            "eUsrJob_ProcessAllRxFrames - not all previously sent frames are received/processed (frame loss)!"
            ;
          }
          else {
            szFormat = "Error: System overload: Cycle time too short or huge jitter!";
          }
          CAtEmLogging::LogError(S_poLog,szFormat);
        }
        else {
          iVar20 = iVar7 - (uint)(0 < iVar7);
        }
      }
      ecatPerfMeasStart(&S_TscMeasDesc,6);
      local_38 = (EC_T_CHAR *)0x0;
      emDcmGetLog(0,&local_38);
      if (local_38 != (EC_T_CHAR *)0x0) {
        CAtEmLogging::LogDcm(S_poLog,local_38);
      }
      ecatPerfMeasEnd(&S_TscMeasDesc,6);
      ecatPerfMeasStart(&S_TscMeasDesc,5);
      iVar7 = *(int *)(*(long *)((long)pvThreadParamDesc + 0x28) + 0x7738);
      pEVar13 = (EC_T_BYTE *)emGetProcessImageInputPtr(0);
      pEVar14 = (EC_T_BYTE *)emGetProcessImageOutputPtr(0);
      local_3d = 0;
      if (callbackFct == (_func_void_EC_T_BYTE_ptr_EC_T_BYTE_ptr *)0x0) {
        CAtEmLogging::LogError(S_poLog,"callbackFct is not defined");
      }
      else {
        (*callbackFct)(pEVar13,pEVar14);
      }
      myAppWorkpd(CAtEmLogging*,int,unsigned_char*,unsigned_char*)::s_dwWorkpdCnt =
           myAppWorkpd(CAtEmLogging*,int,unsigned_char*,unsigned_char*)::s_dwWorkpdCnt + 1;
      if (((uint)(myAppWorkpd(CAtEmLogging*,int,unsigned_char*,unsigned_char*)::s_dwWorkpdCnt *
                 -0x3d70a3d7) >> 2 |
          myAppWorkpd(CAtEmLogging*,int,unsigned_char*,unsigned_char*)::s_dwWorkpdCnt * 0x40000000)
          < 0x28f5c29) {
        uVar15 = (ulong)S_dwSlaveIdx14;
        if (pEVar13 != (EC_T_BYTE *)0x0 && uVar15 != 0xffff) {
          EVar1 = S_aSlaveList[uVar15].dwPdOffsIn;
          if (EVar1 != 0xffffffff) {
            EVar2 = S_aSlaveList[uVar15].dwPdSizeIn;
            if (EVar2 != 0) {
              EVar9 = 8;
              if ((int)EVar2 < 8) {
                EVar9 = EVar2;
              }
              EVar17 = EVar1 + 7;
              if (-1 < (int)EVar1) {
                EVar17 = EVar1;
              }
              uVar8 = (uint)pEVar13[(int)EVar17 >> 3];
              if (8 < (int)(EVar2 + EVar1)) {
                uVar8 = (uint)CONCAT11(pEVar13[(long)((int)EVar17 >> 3) + 1],
                                       pEVar13[(int)EVar17 >> 3]);
              }
              local_3d = (byte)(uVar8 >> ((byte)EVar1 & 7)) & ~(byte)(-1 << ((byte)EVar9 & 0x1f));
              if (EVar2 - EVar9 != 0 && (int)EVar9 <= (int)EVar2) {
                uVar8 = EVar9 + EVar1;
                pbVar23 = (byte *)&local_3c;
                iVar21 = EVar2 - EVar9;
                do {
                  iVar25 = 8;
                  if (iVar21 < 8) {
                    iVar25 = iVar21;
                  }
                  bVar5 = (byte)(-1 << ((byte)iVar25 & 0x1f));
                  *pbVar23 = *pbVar23 & bVar5 |
                             (~bVar5 | 1) &
                             (byte)(*(ushort *)(pEVar13 + ((uVar8 & 0xffff) >> 3)) >>
                                   ((byte)uVar8 & 7));
                  uVar8 = (uVar8 & 0xffff) + iVar25;
                  pbVar23 = pbVar23 + 1;
                  iVar22 = iVar21 - iVar25;
                  bVar4 = iVar25 <= iVar21;
                  iVar21 = iVar22;
                } while (iVar22 != 0 && bVar4);
              }
            }
            if (3 < iVar7 &&
                local_3d !=
                myAppWorkpd(CAtEmLogging*,int,unsigned_char*,unsigned_char*)::s_byDigInputLastVal) {
              CAtEmLogging::LogMsg
                        (S_poLog,"Input Value updated : Old : 0x%x -> New : 0x%x",
                         (ulong)myAppWorkpd(CAtEmLogging*,int,unsigned_char*,unsigned_char*)::
                                s_byDigInputLastVal,(ulong)local_3d);
              myAppWorkpd(CAtEmLogging*,int,unsigned_char*,unsigned_char*)::s_byDigInputLastVal =
                   local_3d;
            }
          }
        }
        uVar15 = (ulong)S_dwSlaveIdx24;
        if (pEVar14 != (EC_T_BYTE *)0x0 && uVar15 != 0xffff) {
          uVar8 = S_aSlaveList[uVar15].dwPdOffsOut;
          if (uVar8 != 0xffffffff) {
            uVar3 = S_aSlaveList[uVar15].dwPdSizeOut;
            if (uVar3 != 0) {
              uVar11 = 8;
              if ((int)uVar3 < 8) {
                uVar11 = uVar3;
              }
              uVar10 = uVar8 + 7;
              if (-1 < (int)uVar8) {
                uVar10 = uVar8;
              }
              uVar24 = (uint)pEVar14[(int)uVar10 >> 3];
              if (8 < (int)(uVar3 + uVar8)) {
                uVar24 = (uint)CONCAT11(pEVar14[(long)((int)uVar10 >> 3) + 1],
                                        pEVar14[(int)uVar10 >> 3]);
              }
              bVar5 = (byte)(-1 << ((byte)uVar11 & 0x1f));
              local_3d = local_3d & bVar5 | (byte)(uVar24 >> ((byte)uVar8 & 7)) & ~bVar5;
              if (uVar3 - uVar11 != 0 && (int)uVar11 <= (int)uVar3) {
                uVar10 = uVar11 + uVar8;
                pbVar23 = (byte *)&local_3c;
                iVar7 = uVar3 - uVar11;
                do {
                  iVar21 = 8;
                  if (iVar7 < 8) {
                    iVar21 = iVar7;
                  }
                  bVar5 = (byte)(-1 << ((byte)iVar21 & 0x1f));
                  *pbVar23 = *pbVar23 & bVar5 |
                             (~bVar5 | 1) &
                             (byte)(*(ushort *)(pEVar14 + ((uVar10 & 0xffff) >> 3)) >>
                                   ((byte)uVar10 & 7));
                  uVar10 = (uVar10 & 0xffff) + iVar21;
                  pbVar23 = pbVar23 + 1;
                  iVar25 = iVar7 - iVar21;
                  bVar4 = iVar21 <= iVar7;
                  iVar7 = iVar25;
                } while (iVar25 != 0 && bVar4);
              }
            }
            local_3d = local_3d + 1;
            if (uVar3 != 0) {
              uVar11 = 8 - (uVar8 & 7);
              if ((int)uVar3 <= (int)uVar11) {
                uVar11 = uVar3;
              }
              uVar24 = ~(-1 << ((byte)uVar11 & 0x1f));
              sVar16 = (sbyte)(uVar8 & 7);
              uVar10 = (uint)local_3d;
              if (8 < (int)uVar3) {
                uVar10 = (uint)CONCAT11((byte)local_3c,local_3d);
              }
              uVar18 = uVar8 + 7;
              if (-1 < (int)uVar8) {
                uVar18 = uVar8;
              }
              iVar7 = (int)uVar18 >> 3;
              pEVar14[iVar7] =
                   (byte)((uVar10 & uVar24) << sVar16) | ~(byte)(uVar24 << sVar16) & pEVar14[iVar7];
              if (uVar3 - uVar11 != 0 && (int)uVar11 <= (int)uVar3) {
                pbVar23 = pEVar14 + iVar7;
                iVar7 = uVar3 - uVar11;
                do {
                  pbVar23 = pbVar23 + 1;
                  iVar21 = 8;
                  if (iVar7 < 8) {
                    iVar21 = iVar7;
                  }
                  bVar5 = (byte)(-1 << ((byte)iVar21 & 0x1f));
                  *pbVar23 = *pbVar23 & bVar5 |
                             (~bVar5 | 1) &
                             (byte)(CONCAT11(*(undefined1 *)
                                              ((long)&local_3c + (ulong)((uVar11 & 0xffff) >> 3)),
                                             local_3d) >> ((byte)uVar11 & 7));
                  uVar11 = (uVar11 & 0xffff) + iVar21;
                  iVar25 = iVar7 - iVar21;
                  bVar4 = iVar21 <= iVar7;
                  iVar7 = iVar25;
                } while (iVar25 != 0 && bVar4);
              }
            }
          }
        }
        if (((ulong)S_dwSlaveIdx4132 != 0xffff && pEVar14 != (EC_T_BYTE *)0x0) &&
           (uVar8 = S_aSlaveList[S_dwSlaveIdx4132].dwPdOffsOut, uVar8 != 0xffffffff)) {
          *(short *)(pEVar14 + (uVar8 >> 3)) = *(short *)(pEVar14 + (uVar8 >> 3)) + 1;
          *(short *)(pEVar14 + (uVar8 + 0x10 >> 3)) = *(short *)(pEVar14 + (uVar8 + 0x10 >> 3)) + -1
          ;
        }
        uVar15 = (ulong)S_dwSlaveIdxETCio100;
        if (uVar15 != 0xffff && pEVar14 != (EC_T_BYTE *)0x0) {
          if (S_aSlaveList[uVar15].dwPdOffsOut != 0xffffffff) {
            pEVar14[S_aSlaveList[uVar15].dwPdOffsOut >> 3] =
                 pEVar14[S_aSlaveList[uVar15].dwPdOffsOut >> 3] + '\x01';
          }
          EVar1 = S_aSlaveList[uVar15].dwPdOffsOut;
          if (EVar1 != 0xffffffff) {
            uVar8 = EVar1 + 8 >> 3;
            sVar19 = *(short *)(pEVar14 + uVar8) + 0x100;
            if (0xfff < (ushort)(*(short *)(pEVar14 + uVar8) + 0x100U)) {
              sVar19 = 0;
            }
            *(short *)(pEVar14 + uVar8) = sVar19;
            uVar8 = EVar1 + 0x18 >> 3;
            sVar19 = *(short *)(pEVar14 + uVar8) + -0x100;
            if (0xfff < (ushort)(*(short *)(pEVar14 + uVar8) - 0x100U)) {
              sVar19 = 0xf00;
            }
            *(short *)(pEVar14 + uVar8) = sVar19;
          }
        }
      }
      ecatPerfMeasEnd(&S_TscMeasDesc,5);
      ecatPerfMeasStart(&S_TscMeasDesc,1);
      uVar8 = emExecJob(0,2,0);
      pCVar6 = S_poLog;
      if (((uVar8 != 0x9811000e) && (uVar8 != 0x9811002d)) && (uVar8 != 0)) {
        uVar12 = ecatGetText(uVar8);
        CAtEmLogging::LogError
                  (pCVar6,"ecatExecJob( eUsrJob_SendAllCycFrames,    EC_NULL ): %s (0x%lx)",uVar12,
                   (ulong)uVar8);
      }
      ecatPerfMeasEnd(&S_TscMeasDesc,1);
      if (uVar8 == 0x98110038) {
        bRun = 0;
      }
      ecatPerfMeasStart(&S_TscMeasDesc,2);
      uVar8 = emExecJob(0,4,0);
      pCVar6 = S_poLog;
      if ((uVar8 != 0x9811000e) && (uVar8 != 0)) {
        uVar12 = ecatGetText(uVar8);
        CAtEmLogging::LogError
                  (pCVar6,"ecatExecJob(eUsrJob_MasterTimer, EC_NULL): %s (0x%lx)",uVar12,
                   (ulong)uVar8);
      }
      ecatPerfMeasEnd(&S_TscMeasDesc,2);
      ecatPerfMeasStart(&S_TscMeasDesc,3);
      uVar8 = emExecJob(0,6,0);
      pCVar6 = S_poLog;
      if (((uVar8 != 0x9811000e) && (uVar8 != 0x9811002d)) && (uVar8 != 0)) {
        uVar12 = ecatGetText(uVar8);
        CAtEmLogging::LogError
                  (pCVar6,"ecatExecJob(eUsrJob_SendAcycFrames, EC_NULL): %s (0x%lx)",uVar12,
                   (ulong)uVar8);
      }
      ecatPerfMeasEnd(&S_TscMeasDesc,3);
      iVar7 = iVar20;
    } while (*(int *)((long)pvThreadParamDesc + 8) == 0);
    ecatPerfMeasShow(&S_TscMeasDesc,0xffffffff,S_aszMeasInfo);
    *(undefined4 *)((long)pvThreadParamDesc + 4) = 0;
    return;
  }
  CAtEmLogging::LogError
            (S_poLog,"Error: Set job task affinitiy, invalid CPU index %d\n",
             (ulong)*(uint *)((long)pvThreadParamDesc + 0x18));
  return;
}

Assistant:

static EC_T_VOID tEcJobTask(EC_T_VOID* pvThreadParamDesc)
{
    EC_T_DWORD           dwRes             = EC_E_ERROR;
    T_DEMO_THREAD_PARAM* pDemoThreadParam  = (T_DEMO_THREAD_PARAM*)pvThreadParamDesc;
    EC_T_CPUSET          CpuSet;
    EC_T_BOOL            bPrevCycProcessed = EC_FALSE;
    EC_T_INT             nOverloadCounter  = 0;               /* counter to check if cycle time is to short */
    EC_T_BOOL            bOk;

    EC_CPUSET_ZERO(CpuSet);
    EC_CPUSET_SET(CpuSet, pDemoThreadParam->dwCpuIndex);
    bOk = OsSetThreadAffinity(EC_NULL, CpuSet);
    if (!bOk)
    {
        LogError("Error: Set job task affinitiy, invalid CPU index %d\n", pDemoThreadParam->dwCpuIndex);
        goto Exit;
    }

    /* Start periodic task right before where it is used,
     * otherwise, OsSleepTillTick() might fail if this thread is suspended before being able to call OsMakeThreadPeriodic() */
#if (defined XENOMAI)
    OsMakeThreadPeriodic(rt_task_self(), pDemoThreadParam->dwBusCycleTimeUsec);
#endif

    /* demo loop */
    pDemoThreadParam->bJobThreadRunning = EC_TRUE;
    do
    {
        /* wait for next cycle (event from scheduler task) */
#if (defined RTAI) || (defined XENOMAI)
        OsSleepTillTick(); /* period is set after creating jobtask */
#else
        OsWaitForEvent(pDemoThreadParam->pvTimingEvent, EC_WAITINFINITE);
#endif /* !RTAI && !XENOMAI*/

        PERF_JOB_END(PERF_CycleTime);
        PERF_JOB_START(PERF_CycleTime);

        /* process all received frames (read new input values) */
        PERF_JOB_START(JOB_ProcessAllRxFrames);
        dwRes = ecatExecJob(eUsrJob_ProcessAllRxFrames, &bPrevCycProcessed);
        if (EC_E_NOERROR != dwRes && EC_E_INVALIDSTATE != dwRes && EC_E_LINK_DISCONNECTED != dwRes)
        {
            LogError("ERROR: ecatExecJob( eUsrJob_ProcessAllRxFrames): %s (0x%lx)", ecatGetText(dwRes), dwRes);
        }
        PERF_JOB_END(JOB_ProcessAllRxFrames);

        if (EC_E_NOERROR == dwRes)
        {
            if (!bPrevCycProcessed)
            {
                /* it is not reasonable, that more than 5 continuous frames are lost */
                nOverloadCounter += 10;
                if (nOverloadCounter >= 50)
                {
                    LogError( "Error: System overload: Cycle time too short or huge jitter!" );
                }
                else
                {
                    LogError( "eUsrJob_ProcessAllRxFrames - not all previously sent frames are received/processed (frame loss)!" );
                }
            }
            else
            {
                /* everything o.k.? If yes, decrement overload counter */
                if (nOverloadCounter > 0)    nOverloadCounter--;
            }
        }
        /* handle DCM logging */
#ifdef DCM_ENABLE_LOGFILE
        PERF_JOB_START(PERF_DCM_Logfile);
        {
            EC_T_CHAR* pszLog = EC_NULL;

            ecatDcmGetLog(&pszLog);
            if (EC_NULL != pszLog)
            {
                LogDcm(pszLog);
            }
        }
        PERF_JOB_END(PERF_DCM_Logfile);
#endif

        /*****************************************************/
        /* Demo code: Remove/change this in your application: Working process data cyclic call */
        /*****************************************************/
        PERF_JOB_START(PERF_myAppWorkpd);
        myAppWorkpd(pDemoThreadParam->pLogInst, pDemoThreadParam->pNotInst->Verbose(), ecatGetProcessImageInputPtr(), ecatGetProcessImageOutputPtr());
        PERF_JOB_END(PERF_myAppWorkpd);

        /* write output values of current cycle, by sending all cyclic frames */
        PERF_JOB_START(JOB_SendAllCycFrames);
        dwRes = ecatExecJob( eUsrJob_SendAllCycFrames, EC_NULL );
        if (EC_E_NOERROR != dwRes && EC_E_INVALIDSTATE != dwRes && EC_E_LINK_DISCONNECTED != dwRes)
        {
            LogError("ecatExecJob( eUsrJob_SendAllCycFrames,    EC_NULL ): %s (0x%lx)", ecatGetText(dwRes), dwRes);
        }
        PERF_JOB_END(JOB_SendAllCycFrames);

        /* remove this code when using licensed version */
        if (EC_E_EVAL_EXPIRED == dwRes )
        {
            bRun = EC_FALSE;        /* set shutdown flag */
        }

        /* Execute some administrative jobs. No bus traffic is performed by this function */
        PERF_JOB_START(JOB_MasterTimer);
        dwRes = ecatExecJob(eUsrJob_MasterTimer, EC_NULL);
        if (EC_E_NOERROR != dwRes && EC_E_INVALIDSTATE != dwRes)
        {
            LogError("ecatExecJob(eUsrJob_MasterTimer, EC_NULL): %s (0x%lx)", ecatGetText(dwRes), dwRes);
        }
        PERF_JOB_END(JOB_MasterTimer);

        /* send queued acyclic EtherCAT frames */
        PERF_JOB_START(JOB_SendAcycFrames);
        dwRes = ecatExecJob(eUsrJob_SendAcycFrames, EC_NULL);
        if (EC_E_NOERROR != dwRes && EC_E_INVALIDSTATE != dwRes && EC_E_LINK_DISCONNECTED != dwRes)
        {
            LogError("ecatExecJob(eUsrJob_SendAcycFrames, EC_NULL): %s (0x%lx)", ecatGetText(dwRes), dwRes);
        }
        PERF_JOB_END(JOB_SendAcycFrames);

#if !(defined NO_OS)
    } while (!pDemoThreadParam->bJobThreadShutdown);

    PERF_MEASURE_JOBS_SHOW();

    pDemoThreadParam->bJobThreadRunning = EC_FALSE;
#else
    /* in case of NO_OS the job task function is called cyclically within the timer ISR */
    }